

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_char_ready_p(sexp ctx,sexp self,sexp_sint_t n,sexp in)

{
  int iVar1;
  sexp in_RCX;
  sexp_uint_t in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  FILE *in_stack_ffffffffffffffc8;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x10)) {
    if ((in_RCX->value).flonum_bits[0x28] == '\0') {
      local_8 = (sexp)&DAT_0000003e;
    }
    else if (((in_RCX->value).type.setters == (sexp)0x0) ||
            (((sexp)(in_RCX->value).port.size <= (in_RCX->value).type.print &&
             (((((in_RCX->value).string.length & 3) == 0 &&
               (((in_RCX->value).type.slots)->tag == 0x12)) ||
              ((in_RCX->value).type.getters != (sexp)0x0)))))) {
      if ((((in_RCX->value).string.length & 3) == 0) && (((in_RCX->value).type.slots)->tag == 0x12))
      {
        if ((in_RCX->value).type.getters == (sexp)0x0) {
          if ((((in_RCX->value).string.length & 3) == 0) &&
             (((in_RCX->value).type.slots)->tag == 0x12)) {
            iVar1 = (int)(((in_RCX->value).type.slots)->value).fileno.fd;
          }
          else {
            iVar1 = -1;
          }
        }
        else {
          iVar1 = fileno((FILE *)(in_RCX->value).type.getters);
        }
        iVar1 = sexp_fileno_ready_p(iVar1);
        local_8 = (sexp)&DAT_0000003e;
        if (iVar1 != 0) {
          local_8 = (sexp)&DAT_0000013e;
        }
      }
      else if ((in_RCX->value).type.getters == (sexp)0x0) {
        local_8 = (sexp)&DAT_0000013e;
      }
      else {
        iVar1 = sexp_stream_ready_p(in_stack_ffffffffffffffc8);
        local_8 = (sexp)&DAT_0000003e;
        if (iVar1 != 0) {
          local_8 = (sexp)&DAT_0000013e;
        }
      }
    }
    else {
      local_8 = (sexp)&DAT_0000013e;
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_char_ready_p (sexp ctx, sexp self, sexp_sint_t n, sexp in) {
  sexp_assert_type(ctx, sexp_iportp, SEXP_IPORT, in);
  if (!sexp_port_openp(in))
    return SEXP_FALSE;
  if (sexp_port_buf(in))
    if (sexp_port_offset(in) < sexp_port_size(in)
        || (!sexp_filenop(sexp_port_fd(in)) && !sexp_port_stream(in)))
      return SEXP_TRUE;
#if SEXP_USE_GREEN_THREADS     /* maybe not just when threads are enabled */
  if (sexp_filenop(sexp_port_fd(in)))
    return sexp_make_boolean(sexp_fileno_ready_p(sexp_port_fileno(in)));
  else if (sexp_port_stream(in))
    return sexp_make_boolean(sexp_stream_ready_p(sexp_port_stream(in)));
#endif
  /* for custom ports and unthreaded compiles we just return true for now */
  return SEXP_TRUE;
}